

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O3

void __thiscall Polymerase::MoveBack(Polymerase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  SpeciesTracker *pSVar4;
  runtime_error *this_00;
  long *plVar5;
  long *plVar6;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->super_MobileElement).start_ < 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"Attempting to assign negative start position to Polymerase object \'",
                   &(this->super_MobileElement).name_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_60 == plVar6) {
      local_50 = *plVar6;
      lStack_48 = plVar5[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar6;
    }
    local_58 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_60);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = std::__cxx11::string::compare((char *)&(this->super_MobileElement).name_);
  if (iVar3 == 0) {
    pSVar4 = SpeciesTracker::Instance();
    iVar3 = -3;
    if ((pSVar4->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto LAB_001146b2;
  }
  iVar3 = -1;
LAB_001146b2:
  uVar1 = (this->super_MobileElement).start_;
  uVar2 = (this->super_MobileElement).stop_;
  (this->super_MobileElement).start_ = iVar3 + uVar1;
  (this->super_MobileElement).stop_ = iVar3 + uVar2;
  return;
}

Assistant:

void Polymerase::MoveBack() {
  if (start_ > 0) {
    if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ -= 3;
    stop_ -= 3;
    } else {
      start_--;
      stop_--;
    }
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Polymerase object '" +
        name_ + "'.");
  }
}